

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments_test.cpp
# Opt level: O0

void __thiscall
HMMSegmentTest_Test1_Test::~HMMSegmentTest_Test1_Test(HMMSegmentTest_Test1_Test *this)

{
  void *in_RDI;
  
  ~HMMSegmentTest_Test1_Test((HMMSegmentTest_Test1_Test *)0x1cd218);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(HMMSegmentTest, Test1) {
  HMMSegment segment("../dict/hmm_model.utf8");;
  {
    const char* str = "我来自北京邮电大学。。。学号123456";
    const char* res[] = {"我来", "自北京", "邮电大学", "。", "。", "。", "学号", "123456"};
    vector<string> words;
    segment.Cut(str, words);
    ASSERT_EQ(words, vector<string>(res, res + sizeof(res)/sizeof(res[0])));
  }

  {
    const char* str = "IBM,1.2,123";
    const char* res[] = {"IBM", ",", "1.2", ",", "123"};
    vector<string> words;
    segment.Cut(str, words);
    ASSERT_EQ(words, vector<string>(res, res + sizeof(res)/sizeof(res[0])));
  }
}